

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O0

void writeInFile(vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *image,int w,int h,string *name)

{
  ostream *poVar1;
  float *pfVar2;
  float *pfVar3;
  float *__b;
  reference this;
  float local_2a0;
  float local_29c;
  ulong local_298;
  size_t j;
  float local_284;
  reference pvStack_280;
  float max;
  Vec3f *c;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220 [8];
  ofstream ofs;
  string *name_local;
  int h_local;
  int w_local;
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> *image_local;
  
  std::ofstream::ofstream(local_220);
  std::operator+(&local_260,"../images/out",name);
  std::operator+(&local_240,&local_260,".ppm");
  std::ofstream::open(local_220,(_Ios_Openmode)&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  poVar1 = std::operator<<((ostream *)local_220,"P6\n");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,w);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,h);
  std::operator<<(poVar1,"\n255\n");
  for (c = (Vec3f *)0x0; c < (Vec3f *)(long)(h * w); c = (Vec3f *)((long)&c->x + 1)) {
    pvStack_280 = std::vector<Vec3<float>,_std::allocator<Vec3<float>_>_>::operator[]
                            (image,(size_type)c);
    pfVar2 = Vec3<float>::operator[](pvStack_280,0);
    pfVar3 = Vec3<float>::operator[](pvStack_280,1);
    __b = Vec3<float>::operator[](pvStack_280,2);
    pfVar3 = std::max<float>(pfVar3,__b);
    pfVar2 = std::max<float>(pfVar2,pfVar3);
    local_284 = *pfVar2;
    if (1.0 < local_284) {
      Vec3<float>::operator*((Vec3<float> *)&j,1.0 / local_284);
      Vec3<float>::operator=(pvStack_280,(Vec3<float> *)&j);
    }
    for (local_298 = 0; local_298 < 3; local_298 = local_298 + 1) {
      local_29c = 0.0;
      local_2a0 = 1.0;
      this = std::vector<Vec3<float>,_std::allocator<Vec3<float>_>_>::operator[](image,(size_type)c)
      ;
      pfVar2 = Vec3<float>::operator[](this,(int)local_298);
      pfVar2 = std::min<float>(&local_2a0,pfVar2);
      pfVar2 = std::max<float>(&local_29c,pfVar2);
      std::operator<<((ostream *)local_220,(char)(int)(*pfVar2 * 255.0));
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void writeInFile(std::vector<Vec3f> &image, int w, int h, std::string name){
    std::ofstream ofs;
    ofs.open("../images/out" + name + ".ppm", std::ios::binary);
    ofs << "P6\n" << w << " " << h << "\n255\n";
    for(size_t i = 0; i < h * w; i++){
        Vec3f &c = image[i];
        float max = std::max(c[0], std::max(c[1], c[2]));
        if (max>1) c = c*(1.f/max);
        for (size_t j = 0; j<3; j++) {
            ofs << (char)(255 * std::max(0.f, std::min(1.f, image[i][j])));
        }
    }
    ofs.close();
}